

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCallback.cc
# Opt level: O0

void __thiscall
flow::NativeCallback::NativeCallback(NativeCallback *this,Runtime *runtime,string *_name)

{
  string *_name_local;
  Runtime *runtime_local;
  NativeCallback *this_local;
  
  this->runtime_ = runtime;
  this->isHandler_ = true;
  std::function<bool_(flow::Instr_*,_flow::IRBuilder_*)>::function(&this->verifier_);
  std::function<void_(flow::Params_&)>::function(&this->function_);
  Signature::Signature(&this->signature_);
  this->attributes_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->names_);
  std::
  vector<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>,_std::allocator<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>_>_>
  ::vector(&this->defaults_);
  Signature::setName(&this->signature_,_name);
  Signature::setReturnType(&this->signature_,Boolean);
  return;
}

Assistant:

NativeCallback::NativeCallback(Runtime* runtime, const std::string& _name)
    : runtime_(runtime),
      isHandler_(true),
      verifier_(),
      function_(),
      signature_(),
      attributes_(0) {
  signature_.setName(_name);
  signature_.setReturnType(LiteralType::Boolean);
}